

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::CPrimitiveMode::Setup(CPrimitiveMode *this)

{
  uint uVar1;
  uint *puVar2;
  uint local_18 [2];
  CPrimitiveMode *local_10;
  CPrimitiveMode *this_local;
  
  local_10 = this;
  uVar1 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
  this->_sizeX = uVar1;
  uVar1 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
  this->_sizeY = uVar1;
  if ((((this->_primitiveType != 5) && (this->_primitiveType != 0xd)) && (this->_primitiveType != 4)
      ) && ((this->_primitiveType != 0xc && (this->_primitiveType != 6)))) {
    this->_sizeX = this->_sizeX & 0xfffffffc;
    this->_sizeY = this->_sizeY & 0xfffffffc;
  }
  if (((int)this->_drawSizeX < 0) || ((int)this->_drawSizeY < 0)) {
    this->_drawSizeX = this->_sizeX;
    this->_drawSizeY = this->_sizeY;
    if (this->_primitiveType == 0) {
      local_18[1] = 100;
      puVar2 = std::min<unsigned_int>(&this->_drawSizeX,local_18 + 1);
      uVar1 = *puVar2;
      this->_drawSizeX = uVar1;
      this->_sizeX = uVar1;
      local_18[0] = 100;
      puVar2 = std::min<unsigned_int>(&this->_drawSizeY,local_18);
      uVar1 = *puVar2;
      this->_drawSizeY = uVar1;
      this->_sizeY = uVar1;
    }
  }
  glu::CallLogWrapper::glClear
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x4000);
  return 0;
}

Assistant:

virtual long Setup()
	{
		_sizeX = getWindowWidth();
		_sizeY = getWindowHeight();
		if (_primitiveType != GL_TRIANGLE_STRIP && _primitiveType != GL_TRIANGLE_STRIP_ADJACENCY &&
			_primitiveType != GL_TRIANGLES && _primitiveType != GL_TRIANGLES_ADJACENCY &&
			_primitiveType != GL_TRIANGLE_FAN)
		{
			_sizeX &= (-4);
			_sizeY &= (-4);
		}
		if ((int)_drawSizeX < 0 || (int)_drawSizeY < 0)
		{
			//no PrimitiveGen dimensions given. assume same dimensions as rendered image^
			_drawSizeX = _sizeX;
			_drawSizeY = _sizeY;
			if (_primitiveType == GL_POINTS)
			{
				//clamp vertex number (and rendering size) for points to max. 10000
				_sizeX = _drawSizeX = std::min(_drawSizeX, 100u);
				_sizeY = _drawSizeY = std::min(_drawSizeY, 100u);
			}
		}

		glClear(GL_COLOR_BUFFER_BIT);
		return NO_ERROR;
	}